

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O0

void __thiscall benchmark::CSVReporter::PrintRunData(CSVReporter *this,Run *run)

{
  ostream *poVar1;
  ulong uVar2;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  string label;
  string local_a8;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  string name;
  double real_time;
  double cpu_time;
  double multiplier;
  Run *run_local;
  CSVReporter *this_local;
  
  real_time = run->cpu_accumulated_time * 1000000000.0;
  name.field_2._8_8_ = run->real_accumulated_time * 1000000000.0;
  if (run->iterations != 0) {
    name.field_2._8_8_ = (size_type)(name.field_2._8_8_ / (double)run->iterations);
    real_time = real_time / (double)run->iterations;
  }
  std::__cxx11::string::string((string *)local_50,(string *)run);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"\"",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"\"\"",(allocator *)(label.field_2._M_local_buf + 0xf));
  ReplaceAll((string *)local_50,&local_70,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(label.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  poVar1 = std::operator<<((ostream *)&std::cout,"\"");
  poVar1 = std::operator<<(poVar1,(string *)local_50);
  std::operator<<(poVar1,"\",");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,run->iterations);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(double)name.field_2._8_8_);
  std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,real_time);
  std::operator<<(poVar1,",");
  if (0.0 < run->bytes_per_second) {
    std::ostream::operator<<(&std::cout,run->bytes_per_second);
  }
  std::operator<<((ostream *)&std::cout,",");
  if (0.0 < run->items_per_second) {
    std::ostream::operator<<(&std::cout,run->items_per_second);
  }
  std::operator<<((ostream *)&std::cout,",");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_d0,(string *)&run->report_label);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"\"",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"\"\"",&local_119);
    ReplaceAll((string *)local_d0,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    poVar1 = std::operator<<((ostream *)&std::cout,"\"");
    poVar1 = std::operator<<(poVar1,(string *)local_d0);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void CSVReporter::PrintRunData(Run const& run) {
  double const multiplier = 1e9;  // nano second multiplier
  double cpu_time = run.cpu_accumulated_time * multiplier;
  double real_time = run.real_accumulated_time * multiplier;
  if (run.iterations != 0) {
    real_time = real_time / static_cast<double>(run.iterations);
    cpu_time = cpu_time / static_cast<double>(run.iterations);
  }

  // Field with embedded double-quote characters must be doubled and the field
  // delimited with double-quotes.
  std::string name = run.benchmark_name;
  ReplaceAll(&name, "\"", "\"\"");
  std::cout << "\"" << name << "\",";

  std::cout << run.iterations << ",";
  std::cout << real_time << ",";
  std::cout << cpu_time << ",";

  if (run.bytes_per_second > 0.0) {
    std::cout << run.bytes_per_second;
  }
  std::cout << ",";
  if (run.items_per_second > 0.0) {
    std::cout << run.items_per_second;
  }
  std::cout << ",";
  if (!run.report_label.empty()) {
    // Field with embedded double-quote characters must be doubled and the field
    // delimited with double-quotes.
    std::string label = run.report_label;
    ReplaceAll(&label, "\"", "\"\"");
    std::cout << "\"" << label << "\"";
  }
  std::cout << '\n';
}